

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void normalize_suite::normalize_two(void)

{
  int *second_begin;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  basic_iterator<int> first_end_04;
  basic_iterator<int> first_end_05;
  basic_iterator<int> first_end_06;
  basic_iterator<int> first_end_07;
  basic_iterator<int> first_end_08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_03;
  reference piVar1;
  ulong uVar2;
  ulong uVar3;
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> input_00;
  initializer_list<int> __l_00;
  initializer_list<int> input_01;
  initializer_list<int> __l_01;
  initializer_list<int> input_02;
  initializer_list<int> __l_02;
  initializer_list<int> input_03;
  initializer_list<int> __l_03;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  basic_iterator<int> first_begin_04;
  basic_iterator<int> first_begin_05;
  basic_iterator<int> first_begin_06;
  basic_iterator<int> first_begin_07;
  basic_iterator<int> first_begin_08;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> expect;
  array<int,_4UL> array;
  allocator_type local_119;
  circular_view<int,_18446744073709551615UL> local_118;
  vector<int,_std::allocator<int>_> local_f8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  int local_d0 [6];
  circular_view<int,_18446744073709551615UL> *local_b8;
  size_type sStack_b0;
  circular_view<int,_18446744073709551615UL> *local_a8;
  size_type sStack_a0;
  circular_view<int,_18446744073709551615UL> *local_98;
  size_type sStack_90;
  circular_view<int,_18446744073709551615UL> *local_88;
  size_type sStack_80;
  circular_view<int,_18446744073709551615UL> *local_78;
  size_type sStack_70;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  circular_view<int,_18446744073709551615UL> *local_48;
  size_type sStack_40;
  circular_view<int,_18446744073709551615UL> *local_38;
  size_type sStack_30;
  circular_view<int,_18446744073709551615UL> *local_28;
  size_type sStack_20;
  
  second_begin = local_d0 + 2;
  local_d0[2] = 0;
  local_d0[3] = 0;
  local_d0[4] = 0;
  local_d0[5] = 0;
  local_118.member.cap = 4;
  local_118.member.size = 0;
  local_118.member.next = 4;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  input._M_len = 4;
  input._M_array = (iterator)&local_f8;
  local_118.member.data = second_begin;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_118,input);
  vista::circular_view<int,_18446744073709551615UL>::remove_front(&local_118,2);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_118.member.next - local_118.member.size;
  }
  else {
    uVar2 = (local_118.member.next - local_118.member.size) % uVar2;
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_118;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f8);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe80,"void normalize_suite::normalize_two()",piVar1 != second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_118);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_118.member.next - local_118.member.size;
  }
  else {
    uVar2 = (local_118.member.next - local_118.member.size) % uVar2;
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_118;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f8);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe82,"void normalize_suite::normalize_two()",piVar1 == second_begin);
  local_d0[0] = 0x21;
  local_d0[1] = 0x2c;
  __l._M_len = 2;
  __l._M_array = local_d0;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l,&local_119);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar2 - 1;
    sStack_20 = uVar2 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar2;
    sStack_20 = local_118.member.next % uVar2;
  }
  second_end._M_current._4_4_ =
       local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end._M_current._0_4_ =
       local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end.current = sStack_20;
  first_end.parent = &local_118;
  first_begin.current = uVar3;
  first_begin.parent = &local_118;
  local_28 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe86,"void normalize_suite::normalize_two()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,second_end);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar2 - 1;
    sStack_30 = uVar2 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar2;
    sStack_30 = local_118.member.next % uVar2;
  }
  first_end_00.current = sStack_30;
  first_end_00.parent = &local_118;
  first_begin_00.current = uVar3;
  first_begin_00.parent = &local_118;
  local_38 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe88,"void normalize_suite::normalize_two()",first_begin_00,first_end_00,second_begin
             ,local_d0 + local_118.member.size + 2);
  if ((view_pointer)
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  input_00._M_len = 5;
  input_00._M_array = (iterator)&local_f8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_118,input_00);
  vista::circular_view<int,_18446744073709551615UL>::remove_front(&local_118,2);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_118.member.next - local_118.member.size;
  }
  else {
    uVar2 = (local_118.member.next - local_118.member.size) % uVar2;
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_118;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f8);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe8e,"void normalize_suite::normalize_two()",piVar1 != second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_118);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_118.member.next - local_118.member.size;
  }
  else {
    uVar2 = (local_118.member.next - local_118.member.size) % uVar2;
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_118;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f8);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe90,"void normalize_suite::normalize_two()",piVar1 == second_begin);
  local_d0[0] = 0x2c;
  local_d0[1] = 0x37;
  __l_00._M_len = 2;
  __l_00._M_array = local_d0;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_00,&local_119);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar2 - 1;
    sStack_40 = uVar2 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar2;
    sStack_40 = local_118.member.next % uVar2;
  }
  second_end_00._M_current._4_4_ =
       local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_00._M_current._0_4_ =
       local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_01.current = sStack_40;
  first_end_01.parent = &local_118;
  first_begin_01.current = uVar3;
  first_begin_01.parent = &local_118;
  local_48 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe94,"void normalize_suite::normalize_two()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,second_end_00);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar2 - 1;
    sStack_50 = uVar2 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar2;
    sStack_50 = local_118.member.next % uVar2;
  }
  first_end_02.current = sStack_50;
  first_end_02.parent = &local_118;
  first_begin_02.current = uVar3;
  first_begin_02.parent = &local_118;
  local_58 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe96,"void normalize_suite::normalize_two()",first_begin_02,first_end_02,second_begin
             ,local_d0 + local_118.member.size + 2);
  if ((view_pointer)
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x42;
  input_01._M_len = 6;
  input_01._M_array = (iterator)&local_f8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_118,input_01);
  vista::circular_view<int,_18446744073709551615UL>::remove_front(&local_118,2);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_118.member.next - local_118.member.size;
  }
  else {
    uVar2 = (local_118.member.next - local_118.member.size) % uVar2;
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_118;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f8);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe9c,"void normalize_suite::normalize_two()",piVar1 == second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_118);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_118.member.next - local_118.member.size;
  }
  else {
    uVar2 = (local_118.member.next - local_118.member.size) % uVar2;
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_118;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f8);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe9e,"void normalize_suite::normalize_two()",piVar1 == second_begin);
  local_d0[0] = 0x37;
  local_d0[1] = 0x42;
  __l_01._M_len = 2;
  __l_01._M_array = local_d0;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_01,&local_119);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar2 - 1;
    sStack_60 = uVar2 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar2;
    sStack_60 = local_118.member.next % uVar2;
  }
  second_end_01._M_current._4_4_ =
       local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_01._M_current._0_4_ =
       local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_03.current = sStack_60;
  first_end_03.parent = &local_118;
  first_begin_03.current = uVar3;
  first_begin_03.parent = &local_118;
  local_68 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xea2,"void normalize_suite::normalize_two()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,second_end_01);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar2 - 1;
    sStack_70 = uVar2 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar2;
    sStack_70 = local_118.member.next % uVar2;
  }
  first_end_04.current = sStack_70;
  first_end_04.parent = &local_118;
  first_begin_04.current = uVar3;
  first_begin_04.parent = &local_118;
  local_78 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xea4,"void normalize_suite::normalize_two()",first_begin_04,first_end_04,second_begin
             ,local_d0 + local_118.member.size + 2);
  if ((view_pointer)
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x42;
  uStack_e0 = 0x4d;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  input_02._M_len = 7;
  input_02._M_array = (iterator)&local_f8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_118,input_02);
  vista::circular_view<int,_18446744073709551615UL>::remove_front(&local_118,2);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_118.member.next - local_118.member.size;
  }
  else {
    uVar2 = (local_118.member.next - local_118.member.size) % uVar2;
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_118;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f8);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeaa,"void normalize_suite::normalize_two()",piVar1 != second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_118);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_118.member.next - local_118.member.size;
  }
  else {
    uVar2 = (local_118.member.next - local_118.member.size) % uVar2;
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_118;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f8);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeac,"void normalize_suite::normalize_two()",piVar1 == second_begin);
  local_d0[0] = 0x42;
  local_d0[1] = 0x4d;
  __l_02._M_len = 2;
  __l_02._M_array = local_d0;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_02,&local_119);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar2 - 1;
    sStack_80 = uVar2 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar2;
    sStack_80 = local_118.member.next % uVar2;
  }
  second_end_02._M_current._4_4_ =
       local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_02._M_current._0_4_ =
       local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_05.current = sStack_80;
  first_end_05.parent = &local_118;
  first_begin_05.current = uVar3;
  first_begin_05.parent = &local_118;
  local_88 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeb0,"void normalize_suite::normalize_two()",first_begin_05,first_end_05,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,second_end_02);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar2 - 1;
    sStack_90 = uVar2 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar2;
    sStack_90 = local_118.member.next % uVar2;
  }
  first_end_06.current = sStack_90;
  first_end_06.parent = &local_118;
  first_begin_06.current = uVar3;
  first_begin_06.parent = &local_118;
  local_98 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeb2,"void normalize_suite::normalize_two()",first_begin_06,first_end_06,second_begin
             ,local_d0 + local_118.member.size + 2);
  if ((view_pointer)
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x42;
  uStack_e0 = 0x4d;
  uStack_dc = 0x58;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  input_03._M_len = 8;
  input_03._M_array = (iterator)&local_f8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_118,input_03);
  vista::circular_view<int,_18446744073709551615UL>::remove_front(&local_118,2);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_118.member.next - local_118.member.size;
  }
  else {
    uVar2 = (local_118.member.next - local_118.member.size) % uVar2;
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_118;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f8);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeb8,"void normalize_suite::normalize_two()",piVar1 != second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_118);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_118.member.next - local_118.member.size;
  }
  else {
    uVar2 = (local_118.member.next - local_118.member.size) % uVar2;
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_118;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_f8);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeba,"void normalize_suite::normalize_two()",piVar1 == second_begin);
  local_d0[0] = 0x4d;
  local_d0[1] = 0x58;
  __l_03._M_len = 2;
  __l_03._M_array = local_d0;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_03,&local_119);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar2 - 1;
    sStack_a0 = uVar2 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar2;
    sStack_a0 = local_118.member.next % uVar2;
  }
  second_end_03._M_current._4_4_ =
       local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_03._M_current._0_4_ =
       local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_07.current = sStack_a0;
  first_end_07.parent = &local_118;
  first_begin_07.current = uVar3;
  first_begin_07.parent = &local_118;
  local_a8 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xebe,"void normalize_suite::normalize_two()",first_begin_07,first_end_07,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,second_end_03);
  uVar2 = local_118.member.cap * 2;
  if ((uVar2 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar2 - 1;
    sStack_b0 = uVar2 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar2;
    sStack_b0 = local_118.member.next % uVar2;
  }
  first_end_08.current = sStack_b0;
  first_end_08.parent = &local_118;
  first_begin_08.current = uVar3;
  first_begin_08.parent = &local_118;
  local_b8 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xec0,"void normalize_suite::normalize_two()",first_begin_08,first_end_08,second_begin
             ,local_d0 + local_118.member.size + 2);
  if ((view_pointer)
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void normalize_two()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    {
        // X X 33 44 => 33 44 X X
        span = { 11, 22, 33, 44 };
        span.remove_front(2);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 55 X X 44 => 44 55 X X
        span = { 11, 22, 33, 44, 55 };
        span.remove_front(2);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 55 66 X X => 55 66 X X
        span = { 11, 22, 33, 44, 55, 66 };
        span.remove_front(2);
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 55, 66 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // X 66 77 X => 66 77 X X
        span = { 11, 22, 33, 44, 55, 66, 77 };
        span.remove_front(2);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 66, 77 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // X X 77 88 => 77 88 X X
        span = { 11, 22, 33, 44, 55, 66, 77, 88 };
        span.remove_front(2);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 77, 88 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
}